

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

void free_dwarf_offsets_chain(Dwarf_Debug dbg,Dwarf_Chain_2_conflict head_chain)

{
  Dwarf_Chain_2 pDVar1;
  
  while (head_chain != (Dwarf_Chain_2_conflict)0x0) {
    pDVar1 = head_chain->ch_next;
    dwarf_dealloc(dbg,head_chain,0x3d);
    head_chain = pDVar1;
  }
  return;
}

Assistant:

static void
free_dwarf_offsets_chain(Dwarf_Debug dbg, Dwarf_Chain_2 head_chain)
{
    Dwarf_Chain_2 cur = head_chain;
    Dwarf_Chain_2 next = 0;

    for ( ; cur ; cur = next ) {
        next = cur->ch_next;
        dwarf_dealloc(dbg, cur, DW_DLA_CHAIN_2);
    }
}